

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

FunctionData * __thiscall
ExpressionContext::GetFunctionOwner(ExpressionContext *this,ScopeData *scopeData)

{
  if (scopeData != (ScopeData *)0x0 && scopeData->type != SCOPE_TEMPORARY) {
    do {
      if (scopeData->ownerType != (TypeBase *)0x0) {
        return (FunctionData *)0x0;
      }
      if (scopeData->ownerNamespace != (NamespaceData *)0x0) {
        return (FunctionData *)0x0;
      }
      if (scopeData->ownerFunction != (FunctionData *)0x0) {
        return scopeData->ownerFunction;
      }
      scopeData = scopeData->scope;
    } while (scopeData != (ScopeData *)0x0);
  }
  return (FunctionData *)0x0;
}

Assistant:

FunctionData* ExpressionContext::GetFunctionOwner(ScopeData *scopeData)
{
	// Temporary scopes have no owner
	if(scopeData->type == SCOPE_TEMPORARY)
		return NULL;

	// Walk up, but if we reach a type or namespace owner, stop - we're not in a context of a function
	for(ScopeData *curr = scopeData; curr; curr = curr->scope)
	{
		if(curr->ownerType)
			return NULL;

		if(curr->ownerNamespace)
			return NULL;

		if(FunctionData *function = curr->ownerFunction)
			return function;
	}

	return NULL;
}